

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O2

void __thiscall nrg::SyncExecutor::operator()(SyncExecutor *this,Function *fn)

{
  std::function<void_()>::operator()(fn);
  return;
}

Assistant:

void operator()(Function fn)
    {
        try {
            fn();
        }
        catch (ExceptionType& ex) {
            onError_(ex);
        }
    }